

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsers.h
# Opt level: O0

MaybeResult<wasm::Ok> *
wasm::WATParser::catchinstr<wasm::WATParser::ParseDeclsCtx>
          (MaybeResult<wasm::Ok> *__return_storage_ptr__,ParseDeclsCtx *ctx)

{
  __index_type *p_Var1;
  ParseDeclsCtx *pPVar2;
  bool bVar3;
  Err *pEVar4;
  basic_string_view<char,_std::char_traits<char>_> bVar5;
  allocator<char> local_3a9;
  string local_3a8;
  Err local_388;
  Err local_360;
  Err *local_340;
  Err *err_5;
  Result<wasm::Ok> _val_5;
  Result<wasm::Ok> label_3;
  Err local_2d0;
  Err *local_2b0;
  Err *err_4;
  Result<wasm::Ok> _val_4;
  Result<wasm::Ok> label_2;
  Err local_240;
  Err *local_220;
  Err *err_3;
  Result<wasm::Ok> _val_3;
  Result<wasm::Ok> label_1;
  Err *err_2;
  Result<wasm::Ok> _val_2;
  Result<wasm::Ok> tag_1;
  Err local_138;
  Err *local_118;
  Err *err_1;
  Result<wasm::Ok> _val_1;
  Result<wasm::Ok> label;
  Err local_b8;
  Err *local_98;
  Err *err;
  undefined1 local_80 [8];
  Result<wasm::Ok> _val;
  Result<wasm::Ok> tag;
  Ok local_19;
  ParseDeclsCtx *pPStack_18;
  CatchT result;
  ParseDeclsCtx *ctx_local;
  
  pPStack_18 = ctx;
  bVar5 = sv("catch",5);
  bVar3 = Lexer::takeSExprStart(&ctx->in,bVar5);
  pPVar2 = pPStack_18;
  if (bVar3) {
    p_Var1 = (__index_type *)
             ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                     super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                     super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                     super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
    tagidx<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)p_Var1,pPStack_18);
    Result<wasm::Ok>::Result((Result<wasm::Ok> *)local_80,(Result<wasm::Ok> *)p_Var1);
    local_98 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_80);
    bVar3 = local_98 != (Err *)0x0;
    if (bVar3) {
      wasm::Err::Err(&local_b8,local_98);
      MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_b8);
      wasm::Err::~Err(&local_b8);
    }
    Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_80);
    if (!bVar3) {
      labelidx<wasm::WATParser::ParseDeclsCtx>
                ((Result<wasm::Ok> *)
                 ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),pPStack_18,false);
      Result<wasm::Ok>::Result
                ((Result<wasm::Ok> *)&err_1,
                 (Result<wasm::Ok> *)
                 ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      local_118 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_1);
      bVar3 = local_118 != (Err *)0x0;
      if (bVar3) {
        wasm::Err::Err(&local_138,local_118);
        MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_138);
        wasm::Err::~Err(&local_138);
      }
      Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_1);
      pPVar2 = pPStack_18;
      if (!bVar3) {
        Result<wasm::Ok>::operator*
                  ((Result<wasm::Ok> *)
                   ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        Result<wasm::Ok>::operator*
                  ((Result<wasm::Ok> *)
                   ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        NullInstrParserCtx::makeCatch((NullInstrParserCtx *)pPVar2);
      }
      bVar3 = bVar3 && bVar3;
      Result<wasm::Ok>::~Result
                ((Result<wasm::Ok> *)
                 ((long)&_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    }
    Result<wasm::Ok>::~Result
              ((Result<wasm::Ok> *)
               ((long)&_val.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
    if (bVar3) {
      return __return_storage_ptr__;
    }
  }
  else {
    bVar5 = sv("catch_ref",9);
    bVar3 = Lexer::takeSExprStart(&pPVar2->in,bVar5);
    pPVar2 = pPStack_18;
    if (bVar3) {
      p_Var1 = (__index_type *)
               ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
      tagidx<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)p_Var1,pPStack_18);
      Result<wasm::Ok>::Result((Result<wasm::Ok> *)&err_2,(Result<wasm::Ok> *)p_Var1);
      pEVar4 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_2);
      bVar3 = pEVar4 != (Err *)0x0;
      if (bVar3) {
        wasm::Err::Err((Err *)((long)&label_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                      super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),pEVar4);
        MaybeResult<wasm::Ok>::MaybeResult
                  (__return_storage_ptr__,
                   (Err *)((long)&label_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                  super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                  super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                  super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        wasm::Err::~Err((Err *)((long)&label_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                       super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                       super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                       super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                       super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      }
      Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_2);
      if (!bVar3) {
        labelidx<wasm::WATParser::ParseDeclsCtx>
                  ((Result<wasm::Ok> *)
                   ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),pPStack_18,false);
        Result<wasm::Ok>::Result
                  ((Result<wasm::Ok> *)&err_3,
                   (Result<wasm::Ok> *)
                   ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        local_220 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_3);
        bVar3 = local_220 != (Err *)0x0;
        if (bVar3) {
          wasm::Err::Err(&local_240,local_220);
          MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_240);
          wasm::Err::~Err(&local_240);
        }
        Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_3);
        pPVar2 = pPStack_18;
        if (!bVar3) {
          Result<wasm::Ok>::operator*
                    ((Result<wasm::Ok> *)
                     ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          Result<wasm::Ok>::operator*
                    ((Result<wasm::Ok> *)
                     ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          NullInstrParserCtx::makeCatchRef((NullInstrParserCtx *)pPVar2);
        }
        bVar3 = bVar3 && bVar3;
        Result<wasm::Ok>::~Result
                  ((Result<wasm::Ok> *)
                   ((long)&_val_3.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      }
      Result<wasm::Ok>::~Result
                ((Result<wasm::Ok> *)
                 ((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
      if (bVar3) {
        return __return_storage_ptr__;
      }
    }
    else {
      bVar5 = sv("catch_all",9);
      bVar3 = Lexer::takeSExprStart(&pPVar2->in,bVar5);
      pPVar2 = pPStack_18;
      if (bVar3) {
        p_Var1 = (__index_type *)
                 ((long)&_val_4.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
        labelidx<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)p_Var1,pPStack_18,false);
        Result<wasm::Ok>::Result((Result<wasm::Ok> *)&err_4,(Result<wasm::Ok> *)p_Var1);
        local_2b0 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_4);
        bVar3 = local_2b0 != (Err *)0x0;
        if (bVar3) {
          wasm::Err::Err(&local_2d0,local_2b0);
          MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_2d0);
          wasm::Err::~Err(&local_2d0);
        }
        Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_4);
        pPVar2 = pPStack_18;
        if (!bVar3) {
          Result<wasm::Ok>::operator*
                    ((Result<wasm::Ok> *)
                     ((long)&_val_4.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          NullInstrParserCtx::makeCatchAll((NullInstrParserCtx *)pPVar2);
        }
        Result<wasm::Ok>::~Result
                  ((Result<wasm::Ok> *)
                   ((long)&_val_4.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        if (bVar3 && bVar3) {
          return __return_storage_ptr__;
        }
      }
      else {
        bVar5 = sv("catch_all_ref",0xd);
        bVar3 = Lexer::takeSExprStart(&pPVar2->in,bVar5);
        if (!bVar3) {
          MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__);
          return __return_storage_ptr__;
        }
        p_Var1 = (__index_type *)
                 ((long)&_val_5.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20);
        labelidx<wasm::WATParser::ParseDeclsCtx>((Result<wasm::Ok> *)p_Var1,pPStack_18,false);
        Result<wasm::Ok>::Result((Result<wasm::Ok> *)&err_5,(Result<wasm::Ok> *)p_Var1);
        local_340 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)&err_5);
        bVar3 = local_340 != (Err *)0x0;
        if (bVar3) {
          wasm::Err::Err(&local_360,local_340);
          MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_360);
          wasm::Err::~Err(&local_360);
        }
        Result<wasm::Ok>::~Result((Result<wasm::Ok> *)&err_5);
        pPVar2 = pPStack_18;
        if (!bVar3) {
          Result<wasm::Ok>::operator*
                    ((Result<wasm::Ok> *)
                     ((long)&_val_5.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                             super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                             super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                             super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          NullInstrParserCtx::makeCatchAllRef((NullInstrParserCtx *)pPVar2);
        }
        Result<wasm::Ok>::~Result
                  ((Result<wasm::Ok> *)
                   ((long)&_val_5.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                           super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                           super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                           super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        if (bVar3 && bVar3) {
          return __return_storage_ptr__;
        }
      }
    }
  }
  bVar3 = Lexer::takeRParen(&pPStack_18->in);
  pPVar2 = pPStack_18;
  if (bVar3) {
    MaybeResult<wasm::Ok>::MaybeResult<wasm::Ok>(__return_storage_ptr__,&local_19);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a8,"expected \')\' at end of catch clause",&local_3a9);
    Lexer::err(&local_388,&pPVar2->in,&local_3a8);
    MaybeResult<wasm::Ok>::MaybeResult(__return_storage_ptr__,&local_388);
    wasm::Err::~Err(&local_388);
    std::__cxx11::string::~string((string *)&local_3a8);
    std::allocator<char>::~allocator(&local_3a9);
  }
  return __return_storage_ptr__;
}

Assistant:

MaybeResult<typename Ctx::CatchT> catchinstr(Ctx& ctx) {
  typename Ctx::CatchT result;
  if (ctx.in.takeSExprStart("catch"sv)) {
    auto tag = tagidx(ctx);
    CHECK_ERR(tag);
    auto label = labelidx(ctx);
    CHECK_ERR(label);
    result = ctx.makeCatch(*tag, *label);
  } else if (ctx.in.takeSExprStart("catch_ref"sv)) {
    auto tag = tagidx(ctx);
    CHECK_ERR(tag);
    auto label = labelidx(ctx);
    CHECK_ERR(label);
    result = ctx.makeCatchRef(*tag, *label);
  } else if (ctx.in.takeSExprStart("catch_all"sv)) {
    auto label = labelidx(ctx);
    CHECK_ERR(label);
    result = ctx.makeCatchAll(*label);
  } else if (ctx.in.takeSExprStart("catch_all_ref"sv)) {
    auto label = labelidx(ctx);
    CHECK_ERR(label);
    result = ctx.makeCatchAllRef(*label);
  } else {
    return {};
  }

  if (!ctx.in.takeRParen()) {
    return ctx.in.err("expected ')' at end of catch clause");
  }

  return result;
}